

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

MainFunc __thiscall capnp::compiler::CompilerMain::getEvalMain(CompilerMain *this)

{
  ProcessContext *context;
  StringPtr extendedDescription;
  StringPtr helpText;
  StringPtr helpText_00;
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr helpText_01;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr helpText_02;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  StringPtr helpText_03;
  initializer_list<kj::MainBuilder::OptionName> names_02;
  StringPtr argumentTitle;
  initializer_list<kj::MainBuilder::OptionName> names_03;
  StringPtr briefDescription;
  StringPtr version;
  MainBuilder *pMVar1;
  Type *func;
  Type *func_00;
  Type *func_01;
  Type *func_02;
  Type *func_03;
  Type *func_04;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  MainFunc MVar2;
  undefined1 local_2ca [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:294:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:294:33)>
  local_2c8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_2b8;
  ArrayPtr<const_char> local_2a8;
  undefined1 local_292 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:293:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:293:40)>
  local_290;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_280;
  StringPtr local_270;
  StringPtr local_260;
  undefined1 local_24a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:289:34),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:289:34)>
  local_248;
  Function<kj::MainBuilder::Validity_()> local_238;
  OptionName local_228 [2];
  StringPtr local_208;
  undefined1 local_1f2 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:287:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:287:40)>
  local_1f0;
  Function<kj::MainBuilder::Validity_()> local_1e0;
  OptionName local_1d0;
  OptionName local_1c0 [2];
  StringPtr local_1a0;
  undefined1 local_18a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:285:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:285:33)>
  local_188;
  Function<kj::MainBuilder::Validity_()> local_178;
  OptionName local_168 [2];
  StringPtr local_148;
  undefined1 local_132 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:283:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:283:40)>
  local_130;
  Function<kj::MainBuilder::Validity_()> local_120;
  OptionName local_110;
  OptionName local_100 [2];
  StringPtr local_e0;
  StringPtr local_d0;
  undefined1 local_ba [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:280:47),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:280:47)>
  local_b8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_a8;
  OptionName local_98;
  OptionName local_88 [3];
  StringPtr local_58;
  StringPtr local_48;
  StringPtr local_38;
  undefined1 local_28 [8];
  MainBuilder builder;
  CompilerMain *this_local;
  
  in_RSI->compileEagerness = 1;
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  in_RSI->convertTo = TEXT;
  ModuleLoader::setFileIdsRequired(&in_RSI->loader,false);
  context = in_RSI->context;
  kj::StringPtr::StringPtr(&local_38,"Cap\'n Proto version 2.0-dev");
  kj::StringPtr::StringPtr
            (&local_48,
             "Prints (or encodes) the value of <name>, which must be defined in <schema-file>.  <name> must refer to a const declaration, a field of a struct type (prints the default value), or a field or list element nested within some other value.  Examples:\n    capnp eval myschema.capnp MyType.someField\n    capnp eval myschema.capnp someConstant\n    capnp eval myschema.capnp someConstant.someField\n    capnp eval myschema.capnp someConstant.someList[4]\n    capnp eval myschema.capnp someConstant.someList[4].anotherField[1][2][3]\nSince consts can have complex struct types, and since you can define a const using import and variable substitution, this can be a convenient way to write text-format config files which are compiled to binary before deployment."
            );
  kj::StringPtr::StringPtr
            (&local_58,
             "By default the value is written in text format and can have any type.  The -b, -p, and --flat flags specify binary output, in which case the const must be of struct type."
            );
  version.content.size_ = local_38.content.size_;
  version.content.ptr = local_38.content.ptr;
  briefDescription.content.size_ = local_48.content.size_;
  briefDescription.content.ptr = local_48.content.ptr;
  extendedDescription.content.size_ = local_58.content.size_;
  extendedDescription.content.ptr = local_58.content.ptr;
  kj::MainBuilder::MainBuilder
            ((MainBuilder *)local_28,context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,(MainBuilder *)local_28);
  kj::MainBuilder::OptionName::OptionName(&local_98,'o');
  kj::MainBuilder::OptionName::OptionName(local_88,"output");
  local_88[1]._0_8_ = &local_98;
  local_88[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x2;
  local_b8.t = (CompilerMain *)
               kj::_::
               boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_2_>
                         ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:280:47),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:280:47)>
                           *)in_RSI,(_ *)(local_ba + 1),(CompilerMain *)local_ba,
                          (Type *)local_38.content.size_,(Type *)local_48.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_a8,&local_b8);
  kj::StringPtr::StringPtr(&local_d0,"<format>");
  kj::StringPtr::StringPtr
            (&local_e0,
             "Encode the output in the given format. See `capnp help convert` for a list of formats. Defaults to \"text\"."
            );
  names_03._M_len = (size_type)local_88[1].field_1;
  names_03._M_array = (iterator)local_88[1]._0_8_;
  argumentTitle.content.size_ = local_d0.content.size_;
  argumentTitle.content.ptr = local_d0.content.ptr;
  func = (Type *)&local_a8;
  helpText.content.size_ = local_e0.content.size_;
  helpText.content.ptr = local_e0.content.ptr;
  pMVar1 = kj::MainBuilder::addOptionWithArg
                     ((MainBuilder *)local_28,names_03,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func,argumentTitle,
                      helpText);
  kj::MainBuilder::OptionName::OptionName(&local_110,'b');
  kj::MainBuilder::OptionName::OptionName(local_100,"binary");
  local_100[1]._0_8_ = &local_110;
  local_100[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x2;
  local_130.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_4_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:283:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:283:40)>
                            *)in_RSI,(_ *)(local_132 + 1),(CompilerMain *)local_132,func,
                           (Type *)local_d0.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_120,&local_130);
  kj::StringPtr::StringPtr(&local_148,"same as -obinary");
  names_02._M_len = (size_type)local_100[1].field_1;
  names_02._M_array = (iterator)local_100[1]._0_8_;
  helpText_03.content.size_ = local_148.content.size_;
  helpText_03.content.ptr = local_148.content.ptr;
  func_00 = (Type *)&local_120;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_02,(Function<kj::MainBuilder::Validity_()> *)func_00,helpText_03)
  ;
  kj::MainBuilder::OptionName::OptionName(local_168,"flat");
  local_168[1]._0_8_ = local_168;
  local_168[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_188.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_6_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:285:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:285:33)>
                            *)in_RSI,(_ *)(local_18a + 1),(CompilerMain *)local_18a,func_00,
                           (Type *)local_148.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_178,&local_188);
  kj::StringPtr::StringPtr(&local_1a0,"same as -oflat");
  names_01._M_len = (size_type)local_168[1].field_1;
  names_01._M_array = (iterator)local_168[1]._0_8_;
  helpText_02.content.size_ = local_1a0.content.size_;
  helpText_02.content.ptr = local_1a0.content.ptr;
  func_01 = (Type *)&local_178;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_01,(Function<kj::MainBuilder::Validity_()> *)func_01,helpText_02)
  ;
  kj::MainBuilder::OptionName::OptionName(&local_1d0,'p');
  kj::MainBuilder::OptionName::OptionName(local_1c0,"packed");
  local_1c0[1]._0_8_ = &local_1d0;
  local_1c0[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x2;
  local_1f0.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_8_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:287:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:287:40)>
                            *)in_RSI,(_ *)(local_1f2 + 1),(CompilerMain *)local_1f2,func_01,
                           (Type *)local_1a0.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_1e0,&local_1f0);
  kj::StringPtr::StringPtr(&local_208,"same as -opacked");
  names_00._M_len = (size_type)local_1c0[1].field_1;
  names_00._M_array = (iterator)local_1c0[1]._0_8_;
  helpText_01.content.size_ = local_208.content.size_;
  helpText_01.content.ptr = local_208.content.ptr;
  func_02 = (Type *)&local_1e0;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_00,(Function<kj::MainBuilder::Validity_()> *)func_02,helpText_01)
  ;
  kj::MainBuilder::OptionName::OptionName(local_228,"short");
  local_228[1]._0_8_ = local_228;
  local_228[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_248.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_10_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:289:34),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:289:34)>
                            *)in_RSI,(_ *)(local_24a + 1),(CompilerMain *)local_24a,func_02,
                           (Type *)local_208.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_10_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_238,&local_248);
  kj::StringPtr::StringPtr
            (&local_260,
             "If output format is text or JSON, write in short (non-pretty) format. The message will be printed on one line, without using whitespace to improve readability."
            );
  names._M_len = (size_type)local_228[1].field_1;
  names._M_array = (iterator)local_228[1]._0_8_;
  helpText_00.content.size_ = local_260.content.size_;
  helpText_00.content.ptr = local_260.content.ptr;
  func_03 = (Type *)&local_238;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names,(Function<kj::MainBuilder::Validity_()> *)func_03,helpText_00);
  kj::StringPtr::StringPtr(&local_270,"<schema-file>");
  local_290.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_12_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:293:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:293:40)>
                            *)in_RSI,(_ *)(local_292 + 1),(CompilerMain *)local_292,func_03,
                           (Type *)local_260.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_12_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_280,&local_290);
  func_04 = (Type *)&local_280;
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,local_270,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_04);
  kj::StringPtr::StringPtr((StringPtr *)&local_2a8,"<name>");
  local_2c8.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_14_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:294:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:294:33)>
                            *)in_RSI,(_ *)(local_2ca + 1),(CompilerMain *)local_2ca,func_04,
                           (Type *)local_260.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_14_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_2b8,&local_2c8);
  kj::MainBuilder::expectArg(pMVar1,(StringPtr)local_2a8,&local_2b8);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_2b8);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_280);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_238);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_1e0);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_178);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_120);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_a8);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder((MainBuilder *)local_28);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

kj::MainFunc getEvalMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    // Default convert to text unless -o is given.
    convertTo = Format::TEXT;

    // When using `capnp eval`, type IDs don't really matter, because `eval` won't actually use
    // them for anything. When using Cap'n Proto an a config format -- the common use case for
    // `capnp eval` -- the exercise of adding a file ID to every file is pointless busy work. So,
    // we don't require it.
    loader.setFileIdsRequired(false);

    kj::MainBuilder builder(context, VERSION_STRING,
          "Prints (or encodes) the value of <name>, which must be defined in <schema-file>.  "
          "<name> must refer to a const declaration, a field of a struct type (prints the default "
          "value), or a field or list element nested within some other value.  Examples:\n"
          "    capnp eval myschema.capnp MyType.someField\n"
          "    capnp eval myschema.capnp someConstant\n"
          "    capnp eval myschema.capnp someConstant.someField\n"
          "    capnp eval myschema.capnp someConstant.someList[4]\n"
          "    capnp eval myschema.capnp someConstant.someList[4].anotherField[1][2][3]\n"
          "Since consts can have complex struct types, and since you can define a const using "
          "import and variable substitution, this can be a convenient way to write text-format "
          "config files which are compiled to binary before deployment.",

          "By default the value is written in text format and can have any type.  The -b, -p, "
          "and --flat flags specify binary output, in which case the const must be of struct "
          "type.");
    addGlobalOptions(builder);
    builder.addOptionWithArg({'o', "output"}, KJ_BIND_METHOD(*this, setEvalOutputFormat),
                      "<format>", "Encode the output in the given format. See `capnp help convert` "
                      "for a list of formats. Defaults to \"text\".")
           .addOption({'b', "binary"}, KJ_BIND_METHOD(*this, codeBinary),
                      "same as -obinary")
           .addOption({"flat"}, KJ_BIND_METHOD(*this, codeFlat),
                      "same as -oflat")
           .addOption({'p', "packed"}, KJ_BIND_METHOD(*this, codePacked),
                      "same as -opacked")
           .addOption({"short"}, KJ_BIND_METHOD(*this, printShort),
                      "If output format is text or JSON, write in short (non-pretty) format. The "
                      "message will be printed on one line, without using whitespace to improve "
                      "readability.")
           .expectArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectArg("<name>", KJ_BIND_METHOD(*this, evalConst));
    return builder.build();
  }